

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void __thiscall clickhouse::Type::~Type(Type *this)

{
  void *pvVar1;
  int *in_RDI;
  EnumImpl *in_stack_ffffffffffffffc0;
  
  if (*in_RDI == 0x10) {
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      ArrayImpl::~ArrayImpl((ArrayImpl *)0x243966);
      operator_delete(pvVar1,0x10);
    }
  }
  else if ((*in_RDI == 0xd) || (*in_RDI == 0xe)) {
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      DateTimeImpl::~DateTimeImpl((DateTimeImpl *)0x2439ac);
      operator_delete(pvVar1,0x28);
    }
  }
  else if (*in_RDI == 0x12) {
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      TupleImpl::~TupleImpl((TupleImpl *)0x2439e8);
      operator_delete(pvVar1,0x18);
    }
  }
  else if (*in_RDI == 0x11) {
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      NullableImpl::~NullableImpl((NullableImpl *)0x243a24);
      operator_delete(pvVar1,0x10);
    }
  }
  else if ((*in_RDI == 0x13) || (*in_RDI == 0x14)) {
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      EnumImpl::~EnumImpl(in_stack_ffffffffffffffc0);
      operator_delete(pvVar1,0x60);
    }
  }
  else if (((((*in_RDI == 0x19) || (*in_RDI == 0x1a)) || (*in_RDI == 0x1b)) || (*in_RDI == 0x1c)) &&
          (*(void **)(in_RDI + 2) != (void *)0x0)) {
    operator_delete(*(void **)(in_RDI + 2),0x10);
  }
  return;
}

Assistant:

Type::~Type() {
    if (code_ == Array) {
        delete array_;
    } else if (code_ == DateTime || code_ == DateTime64) {
        delete date_time_;
    } else if (code_ == Tuple) {
        delete tuple_;
    } else if (code_ == Nullable) {
        delete nullable_;
    } else if (code_ == Enum8 || code_ == Enum16) {
        delete enum_;
    } else if (code_== Decimal || code_== Decimal32 || code_ == Decimal64 || code_ == Decimal128) {
        delete decimal_;
    }
}